

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O0

vector<int,_false,_6> __thiscall
immutable::vector<int,_false,_6>::erase
          (vector<int,_false,_6> *this,size_type_conflict from,size_type_conflict to)

{
  uint in_ECX;
  undefined4 in_register_00000034;
  vector<int,_false,_6> local_38;
  byte local_29;
  vector<int,_false,_6> local_28;
  size_type_conflict local_1c;
  size_type_conflict to_local;
  size_type_conflict from_local;
  vector<int,_false,_6> *this_local;
  
  _to_local = (vector<int,_false,_6> *)CONCAT44(in_register_00000034,from);
  local_29 = 0;
  local_1c = to;
  this_local = this;
  if (to < in_ECX) {
    take(&local_28,from);
    local_29 = 1;
    drop(&local_38,from);
    operator+((immutable *)this,&local_28,&local_38);
    ~vector(&local_38);
  }
  else {
    vector(this,_to_local);
  }
  if ((local_29 & 1) != 0) {
    ~vector(&local_28);
  }
  return (vector<int,_false,_6>)(ref<immutable::rrb<int,_false,_6>_>)this;
}

Assistant:

vector erase(size_type from, size_type to) const
        {
        return to > from ? take(from) + drop(to) : *this;
        }